

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O1

void Rml::ReleaseCompiledGeometry(RenderInterface *match_render_interface)

{
  long *plVar1;
  pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>
  *render_manager;
  long *plVar2;
  
  if (core_data._8_8_ != 0) {
    plVar1 = *(long **)(core_data._8_8_ + 0x28);
    for (plVar2 = *(long **)(core_data._8_8_ + 0x20); plVar2 != plVar1; plVar2 = plVar2 + 2) {
      if ((match_render_interface == (RenderInterface *)0x0) ||
         ((RenderInterface *)*plVar2 == match_render_interface)) {
        RenderManagerAccess::ReleaseAllCompiledGeometry((RenderManager *)plVar2[1]);
      }
    }
  }
  return;
}

Assistant:

explicit operator bool() const noexcept { return pointer != nullptr; }